

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts_tclap.cpp
# Opt level: O0

TEvalOpts * ParseOptions(int argc,char **argv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  float *pfVar3;
  unsigned_long *puVar4;
  TEvalOpts *in_RDI;
  SwitchArg printArg;
  SwitchArg useDoubleArg;
  SwitchArg noDenormalsArg;
  SwitchArg exactArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> archArg
  ;
  ValueArg<unsigned_long> nArg;
  ValueArg<float> maxArg;
  ValueArg<float> minArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> funcArg
  ;
  CmdLine cmd;
  TEvalOpts *res;
  Arg *pAVar5;
  CmdLine *pCVar6;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  string *in_stack_fffffffffffff0b8;
  undefined1 default_val;
  CmdLineInterface *in_stack_fffffffffffff0c0;
  string *in_stack_fffffffffffff0c8;
  string *in_stack_fffffffffffff0d0;
  string *in_stack_fffffffffffff0d8;
  string *flag;
  ValueArg<unsigned_long> *in_stack_fffffffffffff0e0;
  string *in_stack_fffffffffffff0e8;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff0f0;
  Visitor *v;
  Visitor *in_stack_fffffffffffff0f8;
  string *in_stack_fffffffffffff100;
  allocator<char> *argv_00;
  string *in_stack_fffffffffffff108;
  int argc_00;
  undefined8 in_stack_fffffffffffff110;
  char delim;
  string *in_stack_fffffffffffff118;
  CmdLine *in_stack_fffffffffffff120;
  undefined1 local_df1 [40];
  undefined1 local_dc9 [40];
  allocator<char> local_da1;
  string local_da0 [32];
  SwitchArg local_d80;
  undefined8 local_cd1;
  allocator<char> local_ca9;
  string local_ca8 [39];
  allocator<char> local_c81;
  string local_c80 [32];
  SwitchArg local_c60;
  allocator<char> local_bb1;
  string local_bb0 [39];
  undefined1 local_b89 [40];
  allocator<char> local_b61;
  string local_b60 [32];
  SwitchArg local_b40;
  allocator<char> local_a91;
  string local_a90 [39];
  allocator<char> local_a69;
  string local_a68 [39];
  allocator<char> local_a41;
  string local_a40 [32];
  SwitchArg local_a20;
  allocator<char> local_971;
  undefined1 local_970 [40];
  string local_948 [39];
  allocator<char> local_921;
  string local_920 [39];
  allocator<char> local_8f9;
  string local_8f8 [39];
  allocator<char> local_8d1;
  string local_8d0 [32];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b0;
  allocator<char> local_799;
  undefined1 local_798 [40];
  string local_770 [39];
  allocator<char> local_749;
  string local_748 [39];
  allocator<char> local_721;
  string local_720 [32];
  ValueArg<unsigned_long> local_700;
  allocator<char> local_619;
  string local_618 [39];
  allocator<char> local_5f1;
  string local_5f0 [39];
  allocator<char> local_5c9;
  string local_5c8 [39];
  allocator<char> local_5a1;
  string local_5a0 [32];
  ValueArg<float> local_580;
  allocator<char> local_4a1;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [39];
  allocator<char> local_429;
  string local_428 [32];
  ValueArg<float> local_408;
  allocator<char> local_329;
  undefined1 local_328 [40];
  string local_300 [39];
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [32];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  allocator<char> local_151;
  string local_150 [55];
  allocator<char> local_119;
  string local_118 [280];
  
  delim = (char)((ulong)in_stack_fffffffffffff110 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  TCLAP::CmdLine::CmdLine
            (in_stack_fffffffffffff120,in_stack_fffffffffffff118,delim,in_stack_fffffffffffff108,
             SUB81((ulong)in_stack_fffffffffffff100 >> 0x38,0));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  pAVar5 = (Arg *)local_328;
  pCVar6 = (CmdLine *)0x0;
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,(string *)in_stack_fffffffffffff0e0
             ,in_stack_fffffffffffff0d8,SUB81((ulong)in_stack_fffffffffffff0d0 >> 0x38,0),
             in_stack_fffffffffffff0c8,in_stack_fffffffffffff100,
             (Visitor *)in_stack_fffffffffffff108);
  std::__cxx11::string::~string((string *)local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)(local_328 + 0x27));
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  TCLAP::CmdLine::add(pCVar6,pAVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  pAVar5 = (Arg *)0x0;
  TCLAP::ValueArg<float>::ValueArg
            ((ValueArg<float> *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
             in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,
             SUB81((ulong)in_stack_fffffffffffff0c0 >> 0x38,0),SUB84(in_stack_fffffffffffff0c0,0),
             in_stack_fffffffffffff0b8,(Visitor *)in_stack_fffffffffffff0f0);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  TCLAP::CmdLine::add(pCVar6,pAVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  pAVar5 = (Arg *)0x0;
  TCLAP::ValueArg<float>::ValueArg
            ((ValueArg<float> *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
             in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,
             SUB81((ulong)in_stack_fffffffffffff0c0 >> 0x38,0),SUB84(in_stack_fffffffffffff0c0,0),
             in_stack_fffffffffffff0b8,(Visitor *)in_stack_fffffffffffff0f0);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  TCLAP::CmdLine::add(pCVar6,pAVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  pAVar5 = (Arg *)local_798;
  pCVar6 = (CmdLine *)0x0;
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
             in_stack_fffffffffffff0c8,SUB81((ulong)in_stack_fffffffffffff0c0 >> 0x38,0),
             (unsigned_long)in_stack_fffffffffffff0b8,(string *)in_stack_fffffffffffff0f0,
             in_stack_fffffffffffff0f8);
  default_val = (undefined1)((ulong)in_stack_fffffffffffff0b8 >> 0x38);
  std::__cxx11::string::~string((string *)local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)(local_798 + 0x27));
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  TCLAP::CmdLine::add(pCVar6,pAVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  pAVar5 = (Arg *)local_970;
  this = (ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0;
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,(string *)in_stack_fffffffffffff0e0
             ,in_stack_fffffffffffff0d8,SUB81((ulong)in_stack_fffffffffffff0d0 >> 0x38,0),
             in_stack_fffffffffffff0c8,in_stack_fffffffffffff100,
             (Visitor *)in_stack_fffffffffffff108);
  std::__cxx11::string::~string((string *)local_970);
  std::allocator<char>::~allocator(&local_971);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)(local_970 + 0x27));
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator(&local_921);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator(&local_8f9);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  TCLAP::CmdLine::add((CmdLine *)this,pAVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
             in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
             (bool)default_val,(Visitor *)in_stack_fffffffffffff0f0);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  pCVar6 = (CmdLine *)local_b89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  argc_00 = (int)((ulong)&local_bb1 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
             in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
             (bool)default_val,(Visitor *)in_stack_fffffffffffff0f0);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  std::__cxx11::string::~string((string *)(local_b89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b89);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator(&local_b61);
  argv_00 = &local_c81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  v = (Visitor *)&local_cd1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
             in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
             (bool)default_val,v);
  std::__cxx11::string::~string((string *)((long)&local_cd1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator(&local_ca9);
  std::__cxx11::string::~string(local_c80);
  std::allocator<char>::~allocator(&local_c81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e0,(char *)in_stack_fffffffffffff0d8,
             (allocator<char> *)in_stack_fffffffffffff0d0);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar2,(char *)in_stack_fffffffffffff0d8,(allocator<char> *)in_stack_fffffffffffff0d0);
  flag = (string *)local_df1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar2,(char *)flag,(allocator<char> *)in_stack_fffffffffffff0d0);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)pbVar2,flag,in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,
             in_stack_fffffffffffff0c0,(bool)default_val,v);
  std::__cxx11::string::~string((string *)(local_df1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_df1);
  std::__cxx11::string::~string((string *)(local_dc9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_dc9);
  std::__cxx11::string::~string(local_da0);
  std::allocator<char>::~allocator(&local_da1);
  TCLAP::CmdLine::parse(pCVar6,argc_00,(char **)argv_00);
  TEvalOpts::TEvalOpts((TEvalOpts *)this);
  pbVar2 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_268);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)pbVar2);
  pfVar3 = TCLAP::ValueArg<float>::getValue(&local_408);
  in_RDI->Lo = *pfVar3;
  pfVar3 = TCLAP::ValueArg<float>::getValue(&local_580);
  in_RDI->Hi = *pfVar3;
  puVar4 = TCLAP::ValueArg<unsigned_long>::getValue(&local_700);
  in_RDI->N = *puVar4;
  pbVar2 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_8b0);
  std::__cxx11::string::operator=((string *)&in_RDI->Arch,(string *)pbVar2);
  bVar1 = TCLAP::SwitchArg::getValue(&local_a20);
  in_RDI->Exact = bVar1;
  bVar1 = TCLAP::SwitchArg::getValue(&local_b40);
  in_RDI->NoDenormals = bVar1;
  bVar1 = TCLAP::SwitchArg::getValue(&local_c60);
  in_RDI->UseDouble = bVar1;
  bVar1 = TCLAP::SwitchArg::getValue(&local_d80);
  in_RDI->Print = bVar1;
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)0x118055);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)0x118062);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)0x11806f);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)0x11807c);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(this);
  TCLAP::ValueArg<unsigned_long>::~ValueArg((ValueArg<unsigned_long> *)this);
  TCLAP::ValueArg<float>::~ValueArg((ValueArg<float> *)this);
  TCLAP::ValueArg<float>::~ValueArg((ValueArg<float> *)this);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(this);
  TCLAP::CmdLine::~CmdLine((CmdLine *)this);
  return in_RDI;
}

Assistant:

TEvalOpts ParseOptions(int argc, char** argv) {
    TCLAP::CmdLine cmd("Compute <count> values of a <func> in [<min>, <max>] interval");
    TCLAP::ValueArg<std::string> funcArg("", "func", "exp or log or sigm or tanh", true, "exp", "exp|log|sigm|tanh");
    cmd.add(funcArg);
    TCLAP::ValueArg<float> minArg("", "min", "Lower boundary of an interval, default is -100.0", false, -100.0, "FLOAT");
    cmd.add(minArg);
    TCLAP::ValueArg<float> maxArg("", "max", "Upper boundary of an interval, default is 100.0", false, 100.0, "FLOAT");
    cmd.add(maxArg);
    TCLAP::ValueArg<size_t> nArg("c", "count", "Number of values to compute, default is 1000", false, 1000, "N");
    cmd.add(nArg);
    TCLAP::ValueArg<std::string> archArg("", "arch", "Target archicture: plain or avx or avx2, default is avx2", false, "avx2", "plain|avx|avx2");
    cmd.add(archArg);
    TCLAP::SwitchArg exactArg("", "exact", "Use exact version (slower)", cmd, false);
    TCLAP::SwitchArg noDenormalsArg("", "nodenorm", "Don't honor denormals", cmd, false);
    TCLAP::SwitchArg useDoubleArg("", "double", "Use double precision, single precision is used by default", cmd, false);
    TCLAP::SwitchArg printArg("", "print", "", cmd, false);
    cmd.parse(argc, argv);

    TEvalOpts res; 

    res.Func = funcArg.getValue();
    res.Lo = minArg.getValue();
    res.Hi = maxArg.getValue();
    res.N = nArg.getValue();
    res.Arch = archArg.getValue();
    res.Exact = exactArg.getValue();
    res.NoDenormals = noDenormalsArg.getValue();
    res.UseDouble = useDoubleArg.getValue();
    res.Print = printArg.getValue();

    return res;
}